

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

void helics::CoreFactory::addAssociatedCoreType(string_view name,CoreType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_71 [21];
  CoreType in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addType
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  addExtraTypes((string *)this,(CoreType)((ulong)local_71 >> 0x20));
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator(local_71);
  return;
}

Assistant:

void addAssociatedCoreType(std::string_view name, CoreType type)
{
    searchableCores.addType(std::string{name}, type);
    addExtraTypes(std::string{name}, type);
}